

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
jessilib::json_parser::serialize_impl<char8_t,char>
          (json_parser *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_string,
          object *in_object)

{
  object *poVar1;
  object *out_string_00;
  bool bVar2;
  int iVar3;
  type tVar4;
  vector<jessilib::object,_std::allocator<jessilib::object>_> *this_00;
  reference in_object_00;
  size_t sVar5;
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  *this_01;
  reference pvVar6;
  invalid_argument *this_02;
  uint *puVar7;
  array_type *paVar8;
  map_type *this_03;
  v8 *this_04;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> bVar9;
  u8string_view in_string;
  u8string_view in_string_00;
  u8string_view in_string_01;
  u8string_view in_string_02;
  u8string_view in_string_03;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  __sv_type local_2d8;
  reference local_2c8;
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  *item;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  *__range3_1;
  char8_t *local_2a0;
  object *obj;
  const_iterator __end3;
  const_iterator __begin3;
  vector<jessilib::object,_std::allocator<jessilib::object>_> *__range3;
  char8_t *local_270;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_268;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_248;
  __sv_type local_228;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_long_double> local_218;
  undefined3 *local_208;
  undefined8 local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_1c8;
  undefined8 local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_190;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_180;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_170;
  object *local_160;
  object *in_object_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_string_local;
  json_parser *this_local;
  undefined1 local_138 [16];
  undefined3 *local_128;
  undefined8 local_120;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  *local_118;
  undefined3 *local_110;
  undefined8 uStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_long_double>
  *local_f8 [3];
  undefined1 local_e0 [16];
  undefined3 *local_d0;
  undefined8 local_c8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_long_double> *local_c0;
  undefined3 *local_b8;
  undefined8 uStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  undefined3 **local_a0;
  undefined3 *local_98;
  undefined8 uStack_90;
  json_parser **local_80;
  undefined1 *local_78;
  json_parser **local_70;
  json_parser **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined3 **local_50;
  undefined3 *local_48;
  undefined8 uStack_40;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_long_double> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_long_double> **local_28;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_long_double> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  this_03 = (map_type *)out_string;
  local_160 = in_object;
  in_object_local = (object *)out_string;
  out_string_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  if ((serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::s_null_array ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)
                                   ::s_null_array), this_03 = (map_type *)out_string, iVar3 != 0)) {
    std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector
              (&serialize_impl<char8_t,_char>::s_null_array);
    paVar8 = &serialize_impl<char8_t,_char>::s_null_array;
    __cxa_atexit(std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector,
                 &serialize_impl<char8_t,_char>::s_null_array,&__dso_handle);
    __cxa_guard_release(&serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)
                         ::s_null_array);
    this_03 = (map_type *)paVar8;
  }
  if ((serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::
       s_null_map_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)
                                   ::s_null_map_abi_cxx11_), iVar3 != 0)) {
    std::
    map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
    ::map(&serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::
           s_null_map_abi_cxx11_);
    this_03 = &serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::
               s_null_map_abi_cxx11_;
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                 ::~map,&serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)
                         ::s_null_map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)
                         ::s_null_map_abi_cxx11_);
  }
  tVar4 = object::type(local_160);
  out_string_00 = in_object_local;
  poVar1 = local_160;
  puVar7 = &switchD_002bccb1::switchdataD_002d0edc;
  switch(tVar4) {
  case null:
    local_170 = sv("null",4);
    in_string._M_str = (char8_t *)puVar7;
    in_string._M_len = (size_t)local_170._M_str;
    simple_append<char8_t,char>
              ((jessilib *)out_string_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._M_len
               ,in_string);
    break;
  case boolean:
    bVar2 = object::get<bool,_nullptr>(local_160,false);
    poVar1 = in_object_local;
    if (bVar2) {
      local_180 = sv("true",4);
      in_string_00._M_str = (char8_t *)puVar7;
      in_string_00._M_len = (size_t)local_180._M_str;
      simple_append<char8_t,char>
                ((jessilib *)poVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_180._M_len,in_string_00);
    }
    else {
      local_190 = sv("false",5);
      in_string_01._M_str = (char8_t *)puVar7;
      in_string_01._M_len = (size_t)local_190._M_str;
      simple_append<char8_t,char>
                ((jessilib *)poVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_190._M_len,in_string_01);
    }
    break;
  case integer:
    local_1c8.custom.format =
         (_func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v8::appender,_char>_ptr *)
         &empty_format_arg<char>;
    local_1b8 = 2;
    this_04 = (v8 *)0x0;
    local_1c8.long_long_value = object::get<long,_nullptr>(local_160,0);
    local_110 = (undefined3 *)local_1c8.string.size;
    uStack_108 = local_1b8;
    local_118 = &local_1c8;
    local_a0 = &local_110;
    local_128 = (undefined3 *)local_1c8.string.size;
    local_120 = local_1b8;
    local_100 = &local_1b0;
    local_98 = local_128;
    uStack_90 = local_120;
    this_local = (json_parser *)
                 fmt::v8::
                 make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,long&>
                           ((format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_long>
                             *)&local_118->string,this_04,(long *)&local_1b0);
    local_78 = local_138;
    local_80 = &this_local;
    local_60 = 3;
    local_70 = local_80;
    local_68 = local_80;
    local_58 = local_78;
    fmt::v8::vformat_abi_cxx11_(&local_1b0,local_128,local_120,3,local_80);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_object_local,
               &local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    break;
  case decimal:
    local_208 = &empty_format_arg<char>;
    local_200 = 2;
    object::get<long_double,_nullptr>((longdouble *)local_160,(object *)this_03,(longdouble)0);
    local_b8 = local_208;
    uStack_b0 = local_200;
    local_c0 = &local_218;
    local_50 = &local_b8;
    local_d0 = local_208;
    local_c8 = local_200;
    local_a8 = &local_1f8;
    local_48 = local_d0;
    uStack_40 = local_c8;
    local_f8[0] = fmt::v8::
                  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,long_double&>
                            (local_c0,(v8 *)this_03,(longdouble *)&local_1f8);
    local_30 = local_e0;
    local_38 = local_f8;
    local_18 = 0xb;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    fmt::v8::vformat_abi_cxx11_(&local_1f8,local_d0,local_c8,0xb,local_38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_object_local,
               &local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    break;
  case text:
    std::__cxx11::u8string::u8string((u8string *)&local_268);
    object::
    get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
              (&local_248,poVar1,&local_268);
    local_228 = std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)&local_248);
    make_json_string<char8_t,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)out_string_00,
               local_228);
    std::__cxx11::u8string::~u8string((u8string *)&local_248);
    std::__cxx11::u8string::~u8string((u8string *)&local_268);
    break;
  default:
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
    tVar4 = object::type(local_160);
    std::__cxx11::to_string(&local_318,tVar4);
    std::operator+(&local_2f8,"Invalid data type: ",&local_318);
    std::invalid_argument::invalid_argument(this_02,(string *)&local_2f8);
    __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case array:
    sVar5 = object::size(local_160);
    poVar1 = in_object_local;
    if (sVar5 == 0) {
      bVar9 = sv("[]",2);
      __range3 = (vector<jessilib::object,_std::allocator<jessilib::object>_> *)bVar9._M_len;
      local_270 = bVar9._M_str;
      in_string_02._M_str = (char8_t *)puVar7;
      in_string_02._M_len = (size_t)local_270;
      simple_append<char8_t,char>
                ((jessilib *)poVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__range3,
                 in_string_02);
    }
    simple_append<char8_t,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_object_local,
               '[');
    this_00 = object::get<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
                        (local_160,&serialize_impl<char8_t,_char>::s_null_array);
    __end3 = std::vector<jessilib::object,_std::allocator<jessilib::object>_>::begin(this_00);
    obj = (object *)std::vector<jessilib::object,_std::allocator<jessilib::object>_>::end(this_00);
    while (bVar2 = __gnu_cxx::
                   operator==<const_jessilib::object_*,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>_>
                             (&__end3,(__normal_iterator<const_jessilib::object_*,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>_>
                                       *)&obj), ((bVar2 ^ 0xffU) & 1) != 0) {
      in_object_00 = __gnu_cxx::
                     __normal_iterator<const_jessilib::object_*,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>_>
                     ::operator*(&__end3);
      serialize_impl<char8_t,char>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_object_local,in_object_00);
      simple_append<char8_t,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_object_local,',');
      __gnu_cxx::
      __normal_iterator<const_jessilib::object_*,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>_>
      ::operator++(&__end3);
    }
    pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_object_local);
    *pvVar6 = ']';
    break;
  case map:
    sVar5 = object::size(local_160);
    poVar1 = in_object_local;
    if (sVar5 == 0) {
      bVar9 = sv("{}",2);
      __range3_1 = (map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                    *)bVar9._M_len;
      local_2a0 = bVar9._M_str;
      in_string_03._M_str = (char8_t *)puVar7;
      in_string_03._M_len = (size_t)local_2a0;
      simple_append<char8_t,char>
                ((jessilib *)poVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__range3_1,
                 in_string_03);
    }
    simple_append<char8_t,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_object_local,
               '{');
    this_01 = object::
              get<std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>,_nullptr>
                        (local_160,
                         &serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)
                          ::s_null_map_abi_cxx11_);
    __end3_1 = std::
               map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
               ::begin(this_01);
    item = (pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
            *)std::
              map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
              ::end(this_01);
    while (bVar2 = std::operator==(&__end3_1,(_Self *)&item), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_2c8 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
                  ::operator*(&__end3_1);
      poVar1 = in_object_local;
      local_2d8 = std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)local_2c8);
      make_json_string<char8_t,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)poVar1,
                 local_2d8);
      simple_append<char8_t,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_object_local,':');
      serialize_impl<char8_t,char>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_object_local,&local_2c8->second);
      simple_append<char8_t,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_object_local,',');
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
      ::operator++(&__end3_1);
    }
    pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_object_local);
    *pvVar6 = '}';
  }
  return;
}

Assistant:

void json_parser::serialize_impl(std::basic_string<ResultCharT>& out_string, const object& in_object) {
	using namespace std::literals;
	static const object::array_type s_null_array;
	static const object::map_type s_null_map;

	switch (in_object.type()) {
		case object::type::null:
			simple_append<CharT, ResultCharT>(out_string, u8"null"sv);
			return;

		case object::type::boolean:
			if (in_object.get<bool>()) {
				simple_append<CharT, ResultCharT>(out_string, u8"true"sv);
				return;
			}
			simple_append<CharT, ResultCharT>(out_string, u8"false"sv);
			return;

		case object::type::integer:
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string += fmt::format(empty_format_arg<ResultCharT>, in_object.get<intmax_t>());
			}
			else if constexpr (std::is_same_v<ResultCharT, char>){
				auto encoded = fmt::format(empty_format_arg<CharT>, in_object.get<intmax_t>());
				out_string.append(reinterpret_cast<ResultCharT*>(encoded.data()), encoded.size() * sizeof(CharT));
			}
			return;

		case object::type::decimal:
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string += fmt::format(empty_format_arg<ResultCharT>, in_object.get<long double>());
			}
			else if constexpr (std::is_same_v<ResultCharT, char>){
				auto encoded = fmt::format(empty_format_arg<CharT>, in_object.get<long double>());
				out_string.append(reinterpret_cast<ResultCharT*>(encoded.data()), encoded.size() * sizeof(CharT));
			}
			return;

		case object::type::text:
			make_json_string<CharT, ResultCharT>(out_string, in_object.get<std::u8string>());
			return;

		case object::type::array: {
			if (in_object.size() == 0) {
				simple_append<CharT, ResultCharT>(out_string, u8"[]"sv);
			}

			simple_append<CharT, ResultCharT>(out_string, '[');

			// Serialize all objects in array
			for (auto& obj : in_object.get<object::array_type>(s_null_array)) {
				json_parser::serialize_impl<CharT, ResultCharT>(out_string, obj);
				simple_append<CharT, ResultCharT>(out_string, ',');
			}

			// Replace last comma with ']'
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string.back() = ']';
			}
			else if constexpr (std::is_same_v<ResultCharT, char>) {
				out_string.erase(out_string.size() - sizeof(CharT));
				simple_append<CharT, ResultCharT>(out_string, ']');
			}
			// else // not supported
			return;
		}

		case object::type::map: {
			if (in_object.size() == 0) {
				simple_append<CharT, ResultCharT>(out_string, u8"{}"sv);
			}

			simple_append<CharT, ResultCharT>(out_string, '{');

			// Serialize all objects in map
			for (auto& item : in_object.get<object::map_type>(s_null_map)) {
				make_json_string<CharT, ResultCharT>(out_string, item.first);
				simple_append<CharT, ResultCharT>(out_string, ':');
				json_parser::serialize_impl<CharT, ResultCharT>(out_string, item.second);
				simple_append<CharT, ResultCharT>(out_string, ',');
			}

			// Replace last comma with '}'
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string.back() = '}';
			}
			else if constexpr (std::is_same_v<ResultCharT, char>) {
				out_string.erase(out_string.size() - sizeof(CharT));
				simple_append<CharT, ResultCharT>(out_string, '}');
			}
			// else // not supported
			return;
		}

		default:
			throw std::invalid_argument{ "Invalid data type: " + std::to_string(static_cast<size_t>(in_object.type())) };
	}
}